

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

Scope * Scope::Intersection(Scope *a,Scope *b)

{
  bool bVar1;
  Scope *in_RDI;
  Index i;
  const_iterator last;
  const_iterator it;
  Scope *result;
  undefined4 in_stack_ffffffffffffff98;
  Index in_stack_ffffffffffffff9c;
  Scope *this;
  Index in_stack_ffffffffffffffbc;
  Scope *in_stack_ffffffffffffffc0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  undefined1 local_19;
  
  local_19 = 0;
  this = in_RDI;
  Scope(in_RDI);
  local_28._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator*(&local_28);
    bVar1 = Contains(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffff9c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
    if (bVar1) {
      Insert(in_RDI,in_stack_ffffffffffffff9c);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)this,(int)((ulong)in_RDI >> 0x20));
  }
  return this;
}

Assistant:

Scope Scope::Intersection(const Scope& a, const Scope& b)
{
    Scope result;
    SDT::const_iterator it = a.SDT::begin();
    SDT::const_iterator last = a.SDT::end();
    while(it != last)
    {
        Index i = *it;
        if(b.Contains(i))
            result.Insert(i);
        it++;
    }
    return result;
}